

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_resampler_init(ma_resampler_config *pConfig,ma_resampler *pResampler)

{
  double dVar1;
  ma_format mVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  anon_struct_4_1_aa2af3df_for_speex aVar8;
  ma_resample_algorithm mVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ma_uint32 mVar12;
  ma_uint32 mVar13;
  ma_uint32 mVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ma_lpf2 *__s;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  if (((pResampler != (ma_resampler *)0x0) &&
      (memset(pResampler,0,0x670), pConfig != (ma_resampler_config *)0x0)) &&
     ((pConfig->format == ma_format_f32 || (pConfig->format == ma_format_s16)))) {
    mVar2 = pConfig->format;
    mVar12 = pConfig->channels;
    mVar13 = pConfig->sampleRateIn;
    mVar14 = pConfig->sampleRateOut;
    mVar9 = pConfig->algorithm;
    uVar10 = *(undefined4 *)&pConfig->field_0x14;
    mVar3 = (pConfig->linear).lpfOrder;
    uVar11 = *(undefined4 *)&(pConfig->linear).field_0x4;
    aVar8.quality = (pConfig->speex).quality;
    uVar26 = *(undefined4 *)&pConfig->field_0x2c;
    (pResampler->config).linear.lpfNyquistFactor = (pConfig->linear).lpfNyquistFactor;
    (pResampler->config).speex = (anon_struct_4_1_aa2af3df_for_speex)aVar8.quality;
    *(undefined4 *)&(pResampler->config).field_0x2c = uVar26;
    (pResampler->config).algorithm = mVar9;
    *(undefined4 *)&(pResampler->config).field_0x14 = uVar10;
    (pResampler->config).linear.lpfOrder = mVar3;
    *(undefined4 *)&(pResampler->config).linear.field_0x4 = uVar11;
    (pResampler->config).format = mVar2;
    (pResampler->config).channels = mVar12;
    (pResampler->config).sampleRateIn = mVar13;
    (pResampler->config).sampleRateOut = mVar14;
    if (pConfig->algorithm == ma_resample_algorithm_speex) {
      return -0x67;
    }
    if (pConfig->algorithm == ma_resample_algorithm_linear) {
      mVar2 = pConfig->format;
      mVar3 = pConfig->channels;
      uVar16 = pConfig->sampleRateIn;
      uVar19 = pConfig->sampleRateOut;
      uVar4 = (pConfig->linear).lpfOrder;
      dVar1 = (pConfig->linear).lpfNyquistFactor;
      memset((void *)((long)&pResampler->state + 0x20),0,0x620);
      (pResampler->state).linear.config.format = mVar2;
      (pResampler->state).linear.config.channels = mVar3;
      (pResampler->state).linear.config.sampleRateIn = uVar16;
      (pResampler->state).linear.config.sampleRateOut = uVar19;
      *(ulong *)((long)&pResampler->state + 0x10) = (ulong)uVar4;
      *(double *)((long)&pResampler->state + 0x18) = dVar1;
      uVar15 = uVar16;
      uVar18 = uVar19;
      if (uVar19 != 0 && uVar16 != 0) {
        do {
          uVar17 = uVar18;
          uVar18 = uVar15 % uVar17;
          uVar15 = uVar17;
        } while (uVar18 != 0);
        uVar21 = (ulong)uVar16 / (ulong)uVar17;
        uVar16 = (uint)uVar21;
        (pResampler->state).linear.config.sampleRateIn = uVar16;
        uVar20 = (ulong)uVar19 / (ulong)uVar17;
        uVar19 = (uint)uVar20;
        (pResampler->state).linear.config.sampleRateOut = uVar19;
        if ((ulong)uVar4 == 0) {
LAB_00110d8d:
          (pResampler->state).linear.inAdvanceInt = (ma_uint32)(uVar21 / uVar20);
          (pResampler->state).linear.inAdvanceFrac = (ma_uint32)(uVar21 % uVar20);
          *(undefined8 *)((long)&pResampler->state + 0x28) = 1;
          return 0;
        }
        if (uVar4 < 9) {
          uVar5 = uVar20;
          if (uVar19 < uVar16) {
            uVar5 = uVar21;
          }
          if (uVar16 < uVar19) {
            uVar20 = uVar21;
          }
          memset((void *)((long)&pResampler->state + 0x130),0,0x50c);
          if ((mVar2 == ma_format_f32) || (mVar2 == ma_format_s16)) {
            dVar1 = dVar1 * (double)uVar20 * 0.5;
            uVar16 = uVar4 & 1;
            if ((uVar4 & 1) != 0) {
              memset((void *)((long)&pResampler->state + 0x140),0,0x8c);
              if ((mVar2 != ma_format_s16) && (mVar2 != ma_format_f32)) {
                return -2;
              }
              (pResampler->state).linear.lpf.lpf1[0].format = mVar2;
              (pResampler->state).linear.lpf.lpf1[0].channels = mVar3;
              dVar6 = exp((dVar1 * -6.283185307179586) / (double)uVar5);
              fVar22 = (float)dVar6;
              if (mVar2 != ma_format_f32) {
                fVar22 = (float)(int)(dVar6 * 16384.0);
              }
              *(float *)((long)&pResampler->state + 0x148) = fVar22;
            }
            if (uVar4 != 1) {
              __s = (pResampler->state).linear.lpf.lpf2;
              dVar1 = (dVar1 * 6.283185307179586) / (double)uVar5;
              uVar19 = 1;
              uVar21 = 0;
              do {
                uVar15 = (int)uVar21 + 1;
                if (uVar16 == 0) {
                  uVar15 = uVar19;
                }
                dVar6 = sin(1.5707963705062866 -
                            (double)uVar15 *
                            (3.141592653589793 / (double)(int)(uVar4 << ((byte)uVar16 ^ 1))));
                dVar27 = 1.0 / (dVar6 + dVar6);
                dVar6 = sin(dVar1);
                dVar7 = sin(1.5707963705062866 - dVar1);
                dVar6 = dVar6 / (double)(-(ulong)(dVar27 == 0.0) & 0x3ff6a09edbf8b9bb |
                                        ~-(ulong)(dVar27 == 0.0) & (ulong)(dVar27 + dVar27));
                dVar27 = dVar6 + 1.0;
                memset(__s,0,0x11c);
                if ((dVar27 == 0.0) && (!NAN(dVar27))) {
                  return -2;
                }
                if ((mVar2 != ma_format_f32) && (mVar2 != ma_format_s16)) {
                  return -2;
                }
                auVar28._8_8_ = 1.0 - dVar6;
                auVar28._0_8_ = dVar7 * -2.0;
                (__s->bq).format = mVar2;
                (__s->bq).channels = mVar3;
                auVar30._8_8_ = (1.0 - dVar7) * 0.5;
                auVar30._0_8_ = 1.0 - dVar7;
                uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
                auVar29._8_4_ = SUB84(dVar27,0);
                auVar29._0_8_ = dVar27;
                auVar29._12_4_ = uVar26;
                auVar29 = divpd(auVar28,auVar29);
                auVar31._8_4_ = SUB84(dVar27,0);
                auVar31._0_8_ = dVar27;
                auVar31._12_4_ = uVar26;
                auVar31 = divpd(auVar30,auVar31);
                if (mVar2 == ma_format_f32) {
                  fVar22 = (float)auVar31._0_8_;
                  fVar23 = (float)auVar31._8_8_;
                  fVar24 = (float)auVar29._0_8_;
                  fVar25 = (float)auVar29._8_8_;
                }
                else {
                  fVar22 = (float)(int)(auVar31._0_8_ * 16384.0);
                  fVar23 = (float)(int)(auVar31._8_8_ * 16384.0);
                  fVar24 = (float)(int)(auVar29._0_8_ * 16384.0);
                  fVar25 = (float)(int)(auVar29._8_8_ * 16384.0);
                }
                (__s->bq).b0.f32 = fVar23;
                (__s->bq).b1.f32 = fVar22;
                (__s->bq).b2.f32 = fVar23;
                (__s->bq).a1.f32 = fVar24;
                (__s->bq).a2.f32 = fVar25;
                uVar21 = uVar21 + 1;
                __s = __s + 1;
                uVar19 = uVar19 + 2;
              } while (uVar4 >> 1 != uVar21);
            }
            (pResampler->state).linear.lpf.lpf1Count = uVar16;
            (pResampler->state).linear.lpf.lpf2Count = uVar4 >> 1;
            (pResampler->state).linear.lpf.format = mVar2;
            (pResampler->state).linear.lpf.channels = mVar3;
            uVar21 = (ulong)(pResampler->state).linear.config.sampleRateIn;
            uVar20 = (ulong)(pResampler->state).linear.config.sampleRateOut;
            goto LAB_00110d8d;
          }
        }
      }
    }
  }
  return -2;
}

Assistant:

MA_API ma_result ma_resampler_init(const ma_resampler_config* pConfig, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    pResampler->config = *pConfig;

    switch (pConfig->algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            ma_linear_resampler_config linearConfig;
            linearConfig = ma_linear_resampler_config_init(pConfig->format, pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut);
            linearConfig.lpfOrder         = pConfig->linear.lpfOrder;
            linearConfig.lpfNyquistFactor = pConfig->linear.lpfNyquistFactor;

            result = ma_linear_resampler_init(&linearConfig, &pResampler->state.linear);
            if (result != MA_SUCCESS) {
                return result;
            }
        } break;

        case ma_resample_algorithm_speex:
        {
        #if defined(MA_HAS_SPEEX_RESAMPLER)
            int speexErr;
            pResampler->state.speex.pSpeexResamplerState = speex_resampler_init(pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut, pConfig->speex.quality, &speexErr);
            if (pResampler->state.speex.pSpeexResamplerState == NULL) {
                return ma_result_from_speex_err(speexErr);
            }
        #else
            /* Speex resampler not available. */
            return MA_NO_BACKEND;
        #endif
        } break;

        default: return MA_INVALID_ARGS;
    }

    return MA_SUCCESS;
}